

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumDescriptor::GetLocationPath
          (EnumDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  Descriptor *pDVar2;
  char *pcVar3;
  int __c;
  int __c_00;
  value_type_conflict *pvVar4;
  value_type_conflict local_28 [3];
  value_type_conflict local_1c;
  vector<int,_std::allocator<int>_> *local_18;
  vector<int,_std::allocator<int>_> *output_local;
  EnumDescriptor *this_local;
  
  local_18 = output;
  output_local = (vector<int,_std::allocator<int>_> *)this;
  pDVar2 = containing_type(this);
  if (pDVar2 == (Descriptor *)0x0) {
    local_28[1] = 5;
    pvVar4 = local_28 + 1;
    std::vector<int,_std::allocator<int>_>::push_back(local_18,pvVar4);
    pvVar1 = local_18;
    pcVar3 = index(this,(char *)pvVar4,__c_00);
    local_28[0] = (value_type_conflict)pcVar3;
    std::vector<int,_std::allocator<int>_>::push_back(pvVar1,local_28);
  }
  else {
    pDVar2 = containing_type(this);
    Descriptor::GetLocationPath(pDVar2,local_18);
    local_1c = 4;
    pvVar4 = &local_1c;
    std::vector<int,_std::allocator<int>_>::push_back(local_18,pvVar4);
    pvVar1 = local_18;
    pcVar3 = index(this,(char *)pvVar4,__c);
    local_28[2] = (value_type_conflict)pcVar3;
    std::vector<int,_std::allocator<int>_>::push_back(pvVar1,local_28 + 2);
  }
  return;
}

Assistant:

void EnumDescriptor::GetLocationPath(std::vector<int>* output) const {
  if (containing_type()) {
    containing_type()->GetLocationPath(output);
    output->push_back(DescriptorProto::kEnumTypeFieldNumber);
    output->push_back(index());
  } else {
    output->push_back(FileDescriptorProto::kEnumTypeFieldNumber);
    output->push_back(index());
  }
}